

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrConditionalWrapper.cpp
# Opt level: O3

Statement * __thiscall
IRT::OrConditionalWrapper::ToConditional
          (OrConditionalWrapper *this,Label *true_label,Label *false_label)

{
  SubtreeWrapper *pSVar1;
  pointer pcVar2;
  Statement *first;
  SeqStatement *this_00;
  SeqStatement *this_01;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *local_110 [2];
  long local_100 [2];
  Statement *local_f0;
  undefined1 local_e8 [8];
  Label middle_label;
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  Label local_88;
  long *local_68 [2];
  long local_58 [2];
  SeqStatement *local_48;
  SeqStatement *local_40;
  LabelStatement *local_38;
  
  Label::Label((Label *)local_e8);
  local_48 = (SeqStatement *)operator_new(0x18);
  pSVar1 = this->first_;
  middle_label.label_.field_2._8_8_ = local_b8;
  pcVar2 = (true_label->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&middle_label.label_.field_2 + 8),pcVar2,
             pcVar2 + (true_label->label_)._M_string_length);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,local_e8,middle_label.label_._M_dataplus._M_p + (long)local_e8);
  iVar3 = (*pSVar1->_vptr_SubtreeWrapper[4])
                    (pSVar1,(undefined1 *)((long)&middle_label.label_.field_2 + 8),local_a8);
  local_40 = (SeqStatement *)operator_new(0x18);
  local_38 = (LabelStatement *)operator_new(0x28);
  local_88.label_._M_dataplus._M_p = (pointer)&local_88.label_.field_2;
  local_f0 = (Statement *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_e8,middle_label.label_._M_dataplus._M_p + (long)local_e8);
  LabelStatement::LabelStatement(local_38,&local_88);
  pSVar1 = this->second_;
  local_68[0] = local_58;
  pcVar2 = (true_label->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + (true_label->label_)._M_string_length);
  pcVar2 = (false_label->label_)._M_dataplus._M_p;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_110,pcVar2,pcVar2 + (false_label->label_)._M_string_length);
  this_01 = local_40;
  this_00 = local_48;
  iVar3 = (*pSVar1->_vptr_SubtreeWrapper[4])(pSVar1,local_68,local_110);
  first = local_f0;
  SeqStatement::SeqStatement
            (this_01,&local_38->super_Statement,(Statement *)CONCAT44(extraout_var_00,iVar3));
  SeqStatement::SeqStatement(this_00,first,&this_01->super_Statement);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.label_._M_dataplus._M_p != &local_88.label_.field_2) {
    operator_delete(local_88.label_._M_dataplus._M_p,
                    local_88.label_.field_2._M_allocated_capacity + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if ((long *)middle_label.label_.field_2._8_8_ != local_b8) {
    operator_delete((void *)middle_label.label_.field_2._8_8_,local_b8[0] + 1);
  }
  if (local_e8 != (undefined1  [8])&middle_label.label_._M_string_length) {
    operator_delete((void *)local_e8,middle_label.label_._M_string_length + 1);
  }
  return &this_00->super_Statement;
}

Assistant:

Statement *OrConditionalWrapper::ToConditional(Label true_label, Label false_label) {
    Label middle_label;
    return new SeqStatement(
        first_->ToConditional(true_label, middle_label),
        new SeqStatement(
            new LabelStatement(middle_label),
            second_->ToConditional(true_label, false_label)
        )
    );
}